

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O0

int BZ2_bzDecompressEnd(bz_stream *strm)

{
  long *plVar1;
  long in_RDI;
  DState *s;
  int local_4;
  
  if (in_RDI == 0) {
    local_4 = -2;
  }
  else {
    plVar1 = *(long **)(in_RDI + 0x30);
    if (plVar1 == (long *)0x0) {
      local_4 = -2;
    }
    else if (*plVar1 == in_RDI) {
      if (plVar1[0x18a] != 0) {
        (**(code **)(in_RDI + 0x40))(*(undefined8 *)(in_RDI + 0x48),plVar1[0x18a]);
      }
      if (plVar1[0x18b] != 0) {
        (**(code **)(in_RDI + 0x40))(*(undefined8 *)(in_RDI + 0x48),plVar1[0x18b]);
      }
      if (plVar1[0x18c] != 0) {
        (**(code **)(in_RDI + 0x40))(*(undefined8 *)(in_RDI + 0x48),plVar1[0x18c]);
      }
      (**(code **)(in_RDI + 0x40))(*(undefined8 *)(in_RDI + 0x48),*(undefined8 *)(in_RDI + 0x30));
      *(undefined8 *)(in_RDI + 0x30) = 0;
      local_4 = 0;
    }
    else {
      local_4 = -2;
    }
  }
  return local_4;
}

Assistant:

int BZ_API(BZ2_bzDecompressEnd)  ( bz_stream *strm )
{
   DState* s;
   if (strm == NULL) return BZ_PARAM_ERROR;
   s = strm->state;
   if (s == NULL) return BZ_PARAM_ERROR;
   if (s->strm != strm) return BZ_PARAM_ERROR;

   if (s->tt   != NULL) BZFREE(s->tt);
   if (s->ll16 != NULL) BZFREE(s->ll16);
   if (s->ll4  != NULL) BZFREE(s->ll4);

   BZFREE(strm->state);
   strm->state = NULL;

   return BZ_OK;
}